

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O1

void Llb_Nonlin4RecordState
               (Aig_Man_t *pAig,Vec_Int_t *vOrder,uint *pState,char *pValues,int fBackward)

{
  int iVar1;
  Vec_Ptr_t *pVVar2;
  uint uVar3;
  uint uVar4;
  void *pvVar5;
  uint uVar6;
  
  if (0 < pAig->nRegs) {
    pVVar2 = pAig->vCos;
    uVar3 = 0;
    do {
      uVar4 = pAig->nTruePos + uVar3;
      if (((((int)uVar4 < 0) || (pVVar2->nSize <= (int)uVar4)) ||
          (uVar6 = pAig->nTruePis + uVar3, (int)uVar6 < 0)) || (pAig->vCis->nSize <= (int)uVar6)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      if (fBackward == 0) {
        pvVar5 = pAig->vCis->pArray[uVar6];
      }
      else {
        pvVar5 = pVVar2->pArray[uVar4];
      }
      iVar1 = *(int *)((long)pvVar5 + 0x24);
      if (((long)iVar1 < 0) || (vOrder->nSize <= iVar1)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (pValues[vOrder->pArray[iVar1]] == '\x01') {
        pState[uVar3 >> 5] = pState[uVar3 >> 5] | 1 << ((byte)uVar3 & 0x1f);
      }
      uVar3 = uVar3 + 1;
    } while ((int)uVar3 < pAig->nRegs);
  }
  return;
}

Assistant:

void Llb_Nonlin4RecordState( Aig_Man_t * pAig, Vec_Int_t * vOrder, unsigned * pState, char * pValues, int fBackward )
{
    Aig_Obj_t * pObjLo, * pObjLi;
    int i;
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
        if ( pValues[Llb_ObjBddVar(vOrder, fBackward? pObjLi : pObjLo)] == 1 )
            Abc_InfoSetBit( pState, i );
}